

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O3

void VP8LBitReaderSetBuffer(VP8LBitReader *br,uint8_t *buf,size_t len)

{
  uint uVar1;
  
  br->buf = buf;
  br->len = len;
  uVar1 = 1;
  if (((br->pos <= len) && (br->eos == 0)) && (uVar1 = 0, br->pos == len)) {
    uVar1 = (uint)(0x40 < br->bit_pos);
  }
  br->eos = uVar1;
  return;
}

Assistant:

void VP8LBitReaderSetBuffer(VP8LBitReader* const br,
                            const uint8_t* const buf, size_t len) {
  assert(br != NULL);
  assert(buf != NULL);
  assert(len < 0xfffffff8u);   // can't happen with a RIFF chunk.
  br->buf = buf;
  br->len = len;
  // 'pos' > 'len' should be considered a param error.
  br->eos = (br->pos > br->len) || VP8LIsEndOfStream(br);
}